

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

void writeTiled(TiledOutputPart *out,
               vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *buf,
               vector<double,_std::allocator<double>_> *perf)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  time_point in_RDX;
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *in_RSI;
  int iVar5;
  FrameBuffer *in_RDI;
  time_point end;
  int yLevel;
  int xLevel;
  time_point start;
  TileDescription tiling;
  int levelIndex;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  time_point in_stack_ffffffffffffff80;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_24;
  undefined4 local_1c;
  
  local_1c = 0;
  Imf_3_4::TiledOutputPart::header();
  lVar4 = Imf_3_4::Header::tileDescription();
  uVar1 = *(undefined8 *)(lVar4 + 8);
  std::chrono::_V2::steady_clock::now();
  local_3c = 0;
  while( true ) {
    iVar2 = Imf_3_4::TiledOutputPart::numXLevels();
    if (iVar2 <= local_3c) break;
    local_40 = 0;
    while( true ) {
      iVar2 = Imf_3_4::TiledOutputPart::numYLevels();
      if (iVar2 <= local_40) break;
      local_24 = (int)uVar1;
      if ((local_24 == 2) || (local_3c == local_40)) {
        in_stack_ffffffffffffff80.__d.__r = (duration)(duration)in_RDI;
        std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::operator[]
                  (in_RSI,(long)local_1c);
        Imf_3_4::TiledOutputPart::setFrameBuffer((FrameBuffer *)in_stack_ffffffffffffff80.__d.__r);
        iVar5 = (int)in_RDI;
        iVar2 = Imf_3_4::TiledOutputPart::numXTiles(iVar5);
        iVar3 = Imf_3_4::TiledOutputPart::numYTiles(iVar5);
        in_stack_ffffffffffffff68 = local_40;
        Imf_3_4::TiledOutputPart::writeTiles(iVar5,0,iVar2 + -1,0,iVar3 + -1,local_3c);
        local_1c = local_1c + 1;
      }
      local_40 = local_40 + 1;
    }
    local_3c = local_3c + 1;
  }
  if (in_RDX.__d.__r != 0) {
    std::chrono::_V2::steady_clock::now();
    timing(in_stack_ffffffffffffff80,in_RDX);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff70,
               (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
              );
  }
  return;
}

Assistant:

void
writeTiled (
    TiledOutputPart& out, vector<FrameBuffer>& buf, vector<double>* perf)
{
    int levelIndex = 0;

    TileDescription          tiling = out.header ().tileDescription ();
    steady_clock::time_point start  = steady_clock::now ();

    for (int xLevel = 0; xLevel < out.numXLevels (); ++xLevel)
    {
        for (int yLevel = 0; yLevel < out.numYLevels (); ++yLevel)
        {
            if (tiling.mode == RIPMAP_LEVELS || xLevel == yLevel)
            {
                out.setFrameBuffer (buf[levelIndex]);
                out.writeTiles (
                    0,
                    out.numXTiles (xLevel) - 1,
                    0,
                    out.numYTiles (yLevel) - 1,
                    xLevel,
                    yLevel);
                ++levelIndex;
            }
        }
    }
    if (perf)
    {
        steady_clock::time_point end = steady_clock::now ();
        perf->push_back (timing (start, end));
    }
}